

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_format_pre.c
# Opt level: O0

int mpt_parse_format_pre(mpt_parser_format *fmt,mpt_parser_context *parse,mpt_path *path)

{
  int iVar1;
  ushort **ppuVar2;
  uint local_2c;
  int curr;
  mpt_path *path_local;
  mpt_parser_context *parse_local;
  mpt_parser_format *fmt_local;
  
  local_2c = mpt_parse_nextvis(&parse->src,fmt->com,4);
  if ((int)local_2c < 0) {
    if (path->len == 0) {
      fmt_local._4_4_ = 0;
    }
    else {
      fmt_local._4_4_ = -0x10;
    }
  }
  else if (local_2c == fmt->sstart) {
    parse->curr = '\x01';
    iVar1 = mpt_parse_ncheck(path->base + path->len + path->off,(ulong)parse->valid,
                             (uint)(parse->name).sect);
    if (iVar1 < 0) {
      fmt_local._4_4_ = -3;
    }
    else {
      iVar1 = mpt_path_add(path,(uint)parse->valid);
      if (iVar1 < 0) {
        fmt_local._4_4_ = -4;
      }
      else {
        fmt_local._4_4_ = 1;
      }
    }
  }
  else {
    parse->curr = '\b';
    iVar1 = mpt_path_addchar(path,local_2c);
    if (iVar1 < 0) {
      fmt_local._4_4_ = -0x11;
    }
    else {
      do {
        if ((int)local_2c < 0) {
          return -0x10;
        }
        if (local_2c == fmt->send) {
          parse->curr = '\x02';
          return 2;
        }
        if (local_2c == fmt->sstart) break;
        if (local_2c == fmt->ostart) {
          iVar1 = mpt_parse_option(fmt,parse,path);
          return iVar1;
        }
        if (local_2c == fmt->assign) {
          parse->curr = '\v';
          iVar1 = mpt_parse_ncheck(path->base + path->len + path->off,(ulong)parse->valid,
                                   (uint)(parse->name).opt);
          if (iVar1 < 0) {
            return -3;
          }
          iVar1 = mpt_path_add(path,(uint)parse->valid);
          if (iVar1 < 0) {
            return -4;
          }
          mpt_path_invalidate(path);
          parse->valid = 0;
          iVar1 = mpt_parse_data(fmt,parse,path);
          if (iVar1 < 0) {
            return iVar1;
          }
          if (iVar1 == 0) {
            return 3;
          }
          return 7;
        }
        if (local_2c == fmt->oend) break;
        if ((local_2c != 0) &&
           ((((local_2c == fmt->com[0] || (local_2c == fmt->com[1])) || (local_2c == fmt->com[2]))
            || (local_2c == fmt->com[3])))) {
          mpt_parse_endline(&parse->src);
          break;
        }
        parse->curr = '\b';
        ppuVar2 = __ctype_b_loc();
        if (((*ppuVar2)[(int)local_2c] & 0x2000) == 0) {
          iVar1 = mpt_path_valid(path);
          parse->valid = (uint16_t)iVar1;
        }
        else if (local_2c == 10) {
          local_2c = mpt_parse_nextvis(&parse->src,fmt->com,4);
          iVar1 = mpt_path_addchar(path,local_2c);
          if (iVar1 < 0) {
            return -0x11;
          }
          break;
        }
        local_2c = mpt_parse_getchar(&parse->src,path);
      } while (-1 < (int)local_2c);
      if ((fmt->sstart == '\0') || (local_2c != fmt->sstart)) {
        if ((fmt->oend == '\0') || (local_2c != fmt->oend)) {
          parse->curr = '\b';
          fmt_local._4_4_ = -2;
        }
        else {
          parse->curr = '\x04';
          iVar1 = mpt_parse_ncheck(path->base + path->len + path->off,0,(uint)(parse->name).opt);
          if (iVar1 < 0) {
            fmt_local._4_4_ = -3;
          }
          else {
            fmt_local._4_4_ = 4;
          }
        }
      }
      else {
        parse->curr = '\t';
        iVar1 = mpt_parse_ncheck(path->base + path->len + path->off,(ulong)parse->valid,
                                 (uint)(parse->name).sect);
        if (iVar1 < 0) {
          fmt_local._4_4_ = -3;
        }
        else {
          iVar1 = mpt_path_add(path,(uint)parse->valid);
          if (iVar1 < 0) {
            fmt_local._4_4_ = -4;
          }
          else {
            fmt_local._4_4_ = 1;
          }
        }
      }
    }
  }
  return fmt_local._4_4_;
}

Assistant:

extern int mpt_parse_format_pre(const MPT_STRUCT(parser_format) *fmt, MPT_STRUCT(parser_context) *parse, MPT_STRUCT(path) *path)
{
	int curr;
	
	/* get next visible character, no save */
	if ((curr = mpt_parse_nextvis(&parse->src, fmt->com, sizeof(fmt->com))) < 0) {
		if (!path->len) {
			return 0;
		}
		return MPT_ERROR(MissingData);
	}
	if (curr == fmt->sstart) {
		parse->curr = MPT_PARSEFLAG(Section);
		if (mpt_parse_ncheck(path->base + path->off + path->len, parse->valid, parse->name.sect) < 0) {
			return MPT_ERROR(BadType);
		}
		if (mpt_path_add(path, parse->valid) < 0) {
			return MPT_ERROR(BadOperation);
		}
		return MPT_PARSEFLAG(Section);
	}
	parse->curr = MPT_PARSEFLAG(Name);
	if (mpt_path_addchar(path, curr) < 0) {
		return MPT_ERROR(MissingBuffer);
	}
	do {
		if (curr < 0) {
			return MPT_ERROR(MissingData);
		}
		/* found section end */
		if (curr == fmt->send) {
			return parse->curr = MPT_PARSEFLAG(SectEnd);
		}
		/* found section start */
		if (curr == fmt->sstart) {
			break;
		}
		/* parse option name */
		if (curr == fmt->ostart) {
			return mpt_parse_option(fmt, parse, path);
		}
		/* parse option data */
		if (curr == fmt->assign) {
			parse->curr = MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Name);
			if (mpt_parse_ncheck(path->base + path->off + path->len, parse->valid, parse->name.opt) < 0) {
				return MPT_ERROR(BadType);
			}
			if (mpt_path_add(path, parse->valid) < 0) {
				return MPT_ERROR(BadOperation);
			}
			/* clear trailing path data */
			mpt_path_invalidate(path);
			parse->valid = 0;
			
			if ((curr = mpt_parse_data(fmt, parse, path)) < 0) {
				return curr;
			}
			if (!curr) {
				return MPT_PARSEFLAG(Option);
			}
			return MPT_PARSEFLAG(Option) | MPT_PARSEFLAG(Data);
		}
		/* data end found */
		if (curr == fmt->oend) {
			break;
		}
		/* comments: continue to line end without save */
		if (MPT_iscomment(fmt, curr)) {
			(void) mpt_parse_endline(&parse->src);
			break;
		}
		parse->curr = MPT_PARSEFLAG(Name);
		
		/* validate current length character */
		if (!isspace(curr)) {
			parse->valid = mpt_path_valid(path);
		}
		/* get next visible character, no save */
		else if (curr == '\n') {
			curr = mpt_parse_nextvis(&parse->src, fmt->com, sizeof(fmt->com));
			if (mpt_path_addchar(path, curr) < 0) {
				return MPT_ERROR(MissingBuffer);
			}
			break;
		}
	} while ((curr = mpt_parse_getchar(&parse->src, path)) >= 0);
	
	/* last chance to get section start */
	if (fmt->sstart && curr == fmt->sstart) {
		parse->curr = MPT_PARSEFLAG(Section) | MPT_PARSEFLAG(Name);
		if (mpt_parse_ncheck(path->base + path->off + path->len, parse->valid, parse->name.sect) < 0) {
			return MPT_ERROR(BadType);
		}
		if (mpt_path_add(path, parse->valid) < 0) {
			return MPT_ERROR(BadOperation);
		}
		return MPT_PARSEFLAG(Section);
	}
	/* try to pass as data */
	if (fmt->oend && curr == fmt->oend) {
		parse->curr = MPT_PARSEFLAG(Data);
		/* set zero length option name */
		if (mpt_parse_ncheck(path->base + path->off + path->len, 0, parse->name.opt) < 0) {
			return MPT_ERROR(BadType);
		}
		return MPT_PARSEFLAG(Data);
	}
	parse->curr = MPT_PARSEFLAG(Name);
	return MPT_ERROR(BadValue);
}